

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PathArcTo
          (ImDrawList *this,ImVec2 *centre,float radius,float amin,float amax,int num_segments)

{
  int *piVar1;
  float fVar2;
  float fVar3;
  ImVec2 *pIVar4;
  ImGuiContext *pIVar5;
  ImVec2 *pIVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  
  pIVar5 = GImGui;
  if ((radius == 0.0) && (!NAN(radius))) {
    iVar9 = (this->_Path).Size;
    iVar10 = (this->_Path).Capacity;
    if (iVar9 == iVar10) {
      iVar9 = iVar9 + 1;
      if (iVar10 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar10 / 2 + iVar10;
      }
      if (iVar9 < iVar7) {
        iVar9 = iVar7;
      }
      if (iVar10 < iVar9) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        pIVar6 = (ImVec2 *)(*(pIVar5->IO).MemAllocFn)((long)iVar9 << 3);
        pIVar4 = (this->_Path).Data;
        if (pIVar4 != (ImVec2 *)0x0) {
          memcpy(pIVar6,pIVar4,(long)(this->_Path).Size << 3);
        }
        pIVar4 = (this->_Path).Data;
        if (pIVar4 != (ImVec2 *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pIVar4);
        (this->_Path).Data = pIVar6;
        (this->_Path).Capacity = iVar9;
      }
    }
    iVar9 = (this->_Path).Size;
    (this->_Path).Size = iVar9 + 1;
    (this->_Path).Data[iVar9] = *centre;
  }
  pIVar5 = GImGui;
  lVar11 = (long)num_segments + (long)(this->_Path).Size + 1;
  iVar9 = (int)lVar11;
  if ((this->_Path).Capacity < iVar9) {
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    pIVar6 = (ImVec2 *)(*(pIVar5->IO).MemAllocFn)(lVar11 * 8);
    pIVar4 = (this->_Path).Data;
    if (pIVar4 != (ImVec2 *)0x0) {
      memcpy(pIVar6,pIVar4,(long)(this->_Path).Size << 3);
    }
    pIVar4 = (this->_Path).Data;
    if (pIVar4 != (ImVec2 *)0x0) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(GImGui->IO).MemFreeFn)(pIVar4);
    (this->_Path).Data = pIVar6;
    (this->_Path).Capacity = iVar9;
  }
  if (-1 < num_segments) {
    iVar9 = 0;
    do {
      fVar13 = ((float)iVar9 / (float)num_segments) * (amax - amin) + amin;
      fVar2 = centre->x;
      fVar12 = cosf(fVar13);
      fVar3 = centre->y;
      fVar13 = sinf(fVar13);
      pIVar5 = GImGui;
      iVar10 = (this->_Path).Size;
      iVar7 = (this->_Path).Capacity;
      if (iVar10 == iVar7) {
        if (iVar7 == 0) {
          iVar8 = 8;
        }
        else {
          iVar8 = iVar7 / 2 + iVar7;
        }
        iVar10 = iVar10 + 1;
        if (iVar10 < iVar8) {
          iVar10 = iVar8;
        }
        if (iVar7 < iVar10) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + 1;
          pIVar6 = (ImVec2 *)(*(pIVar5->IO).MemAllocFn)((long)iVar10 << 3);
          pIVar4 = (this->_Path).Data;
          if (pIVar4 != (ImVec2 *)0x0) {
            memcpy(pIVar6,pIVar4,(long)(this->_Path).Size << 3);
          }
          pIVar4 = (this->_Path).Data;
          if (pIVar4 != (ImVec2 *)0x0) {
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + -1;
          }
          (*(GImGui->IO).MemFreeFn)(pIVar4);
          (this->_Path).Data = pIVar6;
          (this->_Path).Capacity = iVar10;
        }
      }
      pIVar4 = (this->_Path).Data;
      iVar10 = (this->_Path).Size;
      (this->_Path).Size = iVar10 + 1;
      pIVar4[iVar10].x = fVar12 * radius + fVar2;
      pIVar4[iVar10].y = fVar13 * radius + fVar3;
      iVar9 = iVar9 + 1;
    } while (num_segments + 1 != iVar9);
  }
  return;
}

Assistant:

void ImDrawList::PathArcTo(const ImVec2& centre, float radius, float amin, float amax, int num_segments)
{
    if (radius == 0.0f)
        _Path.push_back(centre);
    _Path.reserve(_Path.Size + (num_segments + 1));
    for (int i = 0; i <= num_segments; i++)
    {
        const float a = amin + ((float)i / (float)num_segments) * (amax - amin);
        _Path.push_back(ImVec2(centre.x + cosf(a) * radius, centre.y + sinf(a) * radius));
    }
}